

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

void __thiscall ON_GeometryValue::~ON_GeometryValue(ON_GeometryValue *this)

{
  ON_Geometry *pOVar1;
  int iVar2;
  ON_Geometry **ppOVar3;
  ON_Geometry *p;
  int count;
  int i;
  ON_GeometryValue *this_local;
  
  (this->super_ON_Value)._vptr_ON_Value = (_func_int **)&PTR__ON_GeometryValue_00b75948;
  iVar2 = ON_SimpleArray<ON_Geometry_*>::Count(&this->m_value);
  for (p._4_4_ = 0; p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
    ppOVar3 = ON_SimpleArray<ON_Geometry_*>::operator[](&this->m_value,p._4_4_);
    pOVar1 = *ppOVar3;
    ppOVar3 = ON_SimpleArray<ON_Geometry_*>::operator[](&this->m_value,p._4_4_);
    *ppOVar3 = (ON_Geometry *)0x0;
    if ((pOVar1 != (ON_Geometry *)0x0) && (pOVar1 != (ON_Geometry *)0x0)) {
      (*(pOVar1->super_ON_Object)._vptr_ON_Object[4])();
    }
  }
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&this->m_value);
  ON_Value::~ON_Value(&this->super_ON_Value);
  return;
}

Assistant:

ON_GeometryValue::~ON_GeometryValue()
{
  int i, count = m_value.Count();
  for ( i = 0; i < count; i++ )
  {
    ON_Geometry* p = m_value[i];
    m_value[i] = 0;
    if (p)
    {
      delete p;
    }
  }
}